

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

size_t Output::VTrace(char16 *shortPrefixFormat,char16 *prefix,char16 *form,__va_list_tag *argptr)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  undefined8 *in_FS_OFFSET;
  uint local_240;
  ULONG i;
  ULONG framesObtained;
  size_t temp;
  size_t start;
  void *frames [10];
  char16 callStackMsg [182];
  size_t c_msgCharCount;
  char16 callStackPrefix [12];
  ULONG c_frameCount;
  ULONG c_framesToSkip;
  size_t retValue;
  __va_list_tag *argptr_local;
  char16 *form_local;
  char16 *prefix_local;
  char16 *shortPrefixFormat_local;
  
  sVar5 = Print(shortPrefixFormat,prefix);
  _c_frameCount = VPrint(form,argptr);
  _c_frameCount = _c_frameCount + sVar5;
  if (s_stackTraceHelper != (IStackTraceHelper *)0x0) {
    c_msgCharCount = 0x6c006c00610063;
    builtin_memcpy(callStackPrefix,L" stack:",0x10);
    if (s_inMemoryLogger == (ILogger *)0x0) {
      sVar5 = Print(L"%s\n",&c_msgCharCount);
      lVar6 = (*(code *)**(undefined8 **)s_stackTraceHelper)(s_stackTraceHelper,2,10);
      _c_frameCount = lVar6 + sVar5 + _c_frameCount;
    }
    else {
      iVar3 = _snwprintf_unsafe((WCHAR *)(frames + 9),0xb6,0xffffffffffffffff,L"%s",&c_msgCharCount)
      ;
      temp = (size_t)iVar3;
      if (temp == 0xffffffffffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                           ,0xc3,"(temp != -1)","temp != -1");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      uVar4 = (**(code **)(*(long *)s_stackTraceHelper + 8))(s_stackTraceHelper,2,10,&start);
      if (10 < uVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                           ,199,"(framesObtained <= c_frameCount)","framesObtained <= c_frameCount")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      for (local_240 = 0; local_240 < uVar4 && local_240 < 10; local_240 = local_240 + 1) {
        if (0xb6 < temp) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                             ,0xca,"((sizeof(*__countof_helper(callStackMsg)) + 0) >= start)",
                             "_countof(callStackMsg) >= start");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        iVar3 = _snwprintf_unsafe(callStackMsg + (temp - 4),0xb6 - temp,0xffffffffffffffff,L" %p",
                                  frames[(ulong)local_240 - 1]);
        if ((long)iVar3 == -1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/Output.cpp"
                             ,0xcc,"(temp != -1)","temp != -1");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        temp = (long)iVar3 + temp;
      }
      sVar5 = Print(L"%s\n",frames + 9);
      _c_frameCount = sVar5 + _c_frameCount;
    }
  }
  return _c_frameCount;
}

Assistant:

size_t
Output::VTrace(const char16* shortPrefixFormat, const char16* prefix, const char16 *form, va_list argptr)
{
    size_t retValue = 0;

#if CONFIG_RICH_TRACE_FORMAT
    if (CONFIG_FLAG(RichTraceFormat))
    {
        InterlockedIncrement(&s_traceEntryId);
        retValue += Output::Print(_u("[%d ~%d %s] "), s_traceEntryId, ::GetCurrentThreadId(), prefix);
    }
    else
#endif
    {
        retValue += Output::Print(shortPrefixFormat, prefix);
    }
    retValue += Output::VPrint(form, argptr);

#ifdef STACK_BACK_TRACE
    // Print stack trace.
    if (s_stackTraceHelper)
    {
        const ULONG c_framesToSkip = 2; // Skip 2 frames -- Output::VTrace and Output::Trace.
        const ULONG c_frameCount = 10;  // TODO: make it configurable.
        const char16 callStackPrefix[] = _u("call stack:");
        if (s_inMemoryLogger)
        {
            // Trace just addresses of functions, avoid symbol info as it takes too much memory.
            // One line for whole stack trace for easier parsing on the jd side.
            const size_t c_msgCharCount = _countof(callStackPrefix) + (1 + sizeof(void*) * 2) * c_frameCount; // 2 hexadecimal digits per byte + 1 for space.
            char16 callStackMsg[c_msgCharCount];
            void* frames[c_frameCount];
            size_t start = 0;
            size_t temp;

            temp = _snwprintf_s(callStackMsg, _countof(callStackMsg), _TRUNCATE, _u("%s"), callStackPrefix);
            Assert(temp != -1);
            start += temp;

            ULONG framesObtained = s_stackTraceHelper->GetStackTrace(c_framesToSkip, c_frameCount, frames);
            Assert(framesObtained <= c_frameCount);
            for (ULONG i = 0; i < framesObtained && i < c_frameCount; ++i)
            {
                Assert(_countof(callStackMsg) >= start);
                temp = _snwprintf_s(callStackMsg + start, _countof(callStackMsg) - start, _TRUNCATE, _u(" %p"), frames[i]);
                Assert(temp != -1);
                start += temp;
            }

            retValue += Output::Print(_u("%s\n"), callStackMsg);
        }
        else
        {
            // Trace with full symbol info.
            retValue += Output::Print(_u("%s\n"), callStackPrefix);
            retValue += s_stackTraceHelper->PrintStackTrace(c_framesToSkip, c_frameCount);
        }
    }
#endif

    return retValue;
}